

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_time.cpp
# Opt level: O0

int __thiscall
booster::locale::impl_icu::calendar_impl::difference
          (calendar_impl *this,abstract_calendar *other_ptr,period_mark p)

{
  UCalendarDateFields UVar1;
  int iVar2;
  Calendar *pCVar3;
  pointer this_00;
  long *in_RSI;
  long in_RDI;
  undefined1 auVar4 [12];
  int diff;
  posix_time p_1;
  guard l;
  calendar_impl *other_cal;
  unique_ptr<icu_70::Calendar,_std::default_delete<icu_70::Calendar>_> self;
  double other_time;
  UErrorCode err;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  unique_lock<std::mutex> *in_stack_ffffffffffffff60;
  long local_78;
  UErrorCode *in_stack_ffffffffffffffa0;
  UDate local_20;
  undefined4 local_18 [2];
  long *local_10;
  
  local_18[0] = 0;
  local_10 = in_RSI;
  pCVar3 = hold_ptr<icu_70::Calendar>::operator->((hold_ptr<icu_70::Calendar> *)(in_RDI + 0x50));
  (**(code **)(*(long *)pCVar3 + 0x18))();
  std::unique_ptr<icu_70::Calendar,std::default_delete<icu_70::Calendar>>::
  unique_ptr<std::default_delete<icu_70::Calendar>,void>
            ((unique_ptr<icu_70::Calendar,_std::default_delete<icu_70::Calendar>_> *)
             in_stack_ffffffffffffff60,
             (pointer)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
  if (local_10 == (long *)0x0) {
    local_78 = 0;
  }
  else {
    local_78 = __dynamic_cast(local_10,&abstract_calendar::typeinfo,&typeinfo,0);
  }
  if (local_78 == 0) {
    auVar4 = (**(code **)(*local_10 + 0x28))();
    in_stack_ffffffffffffffa0 = auVar4._0_8_;
    local_20 = (double)(long)in_stack_ffffffffffffffa0 * 1000.0 + (double)auVar4._8_4_ / 1000000.0;
  }
  else {
    std::unique_lock<std::mutex>::unique_lock
              (in_stack_ffffffffffffff60,
               (mutex_type *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
    hold_ptr<icu_70::Calendar>::operator->((hold_ptr<icu_70::Calendar> *)(local_78 + 0x50));
    local_20 = icu_70::Calendar::getTime
                         ((Calendar *)in_stack_ffffffffffffff60,
                          (UErrorCode *)
                          CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
    check_and_throw_dt(in_stack_ffffffffffffffa0);
    std::unique_lock<std::mutex>::~unique_lock(in_stack_ffffffffffffff60);
  }
  this_00 = std::unique_ptr<icu_70::Calendar,_std::default_delete<icu_70::Calendar>_>::operator->
                      ((unique_ptr<icu_70::Calendar,_std::default_delete<icu_70::Calendar>_> *)
                       0x265fac);
  UVar1 = to_icu((period_mark)in_stack_ffffffffffffffa0);
  iVar2 = (**(code **)(*(long *)this_00 + 0x58))(local_20,this_00,UVar1,local_18);
  check_and_throw_dt(in_stack_ffffffffffffffa0);
  std::unique_ptr<icu_70::Calendar,_std::default_delete<icu_70::Calendar>_>::~unique_ptr
            ((unique_ptr<icu_70::Calendar,_std::default_delete<icu_70::Calendar>_> *)this_00);
  return iVar2;
}

Assistant:

virtual int difference(abstract_calendar const *other_ptr,period::marks::period_mark p) const
        {
            UErrorCode err=U_ZERO_ERROR;
            double other_time = 0;
            //
            // fieldDifference has side effect of moving calendar (WTF?)
            // So we clone it for performing this operation
            // 
            std::unique_ptr<icu::Calendar> self(calendar_->clone());

            calendar_impl const *other_cal=dynamic_cast<calendar_impl const *>(other_ptr);
            if(other_cal){
                guard l(other_cal->lock_);
                other_time = other_cal->calendar_->getTime(err);
                check_and_throw_dt(err);
            }
            else {
                posix_time p = other_ptr->get_time();
                other_time = p.seconds * 1000.0 + p.nanoseconds / 1000000.0;
            }

            int diff = self->fieldDifference(other_time,to_icu(p),err);

            check_and_throw_dt(err);
            return diff;
        }